

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_attr.cpp
# Opt level: O2

bool __thiscall mocker::FuncAttr::isPureFunc(FuncAttr *this,FunctionModule *func)

{
  _List_node_base *v;
  bool bVar1;
  __type _Var2;
  BasicBlock *pBVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  shared_ptr<mocker::ir::Alloca> sVar6;
  shared_ptr<mocker::ir::Alloca> alloca;
  shared_ptr<mocker::ir::Reg> reg;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stackVar;
  long local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  _List_node_base *local_88;
  shared_ptr<mocker::ir::Addr> local_80;
  FuncAttr *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = this;
  pBVar3 = ir::FunctionModule::getBasicBlock
                     (func,(size_t)(func->bbs).
                                   super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                                   ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
  local_88 = (_List_node_base *)&func->bbs;
  p_Var4 = (_List_node_base *)&pBVar3->insts;
  while (p_Var4 = (((_List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&pBVar3->insts) {
    sVar6 = ir::dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&local_98,(shared_ptr<mocker::ir::IRInst> *)(p_Var4 + 1));
    if (local_98 != 0) {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<std::__cxx11::string_const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,*(long *)(local_98 + 0x18) + 8,
                 sVar6.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  }
  local_70 = (FuncAttr *)&local_70->pureFuncs;
  p_Var4 = local_88;
  do {
    p_Var4 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == local_88) {
LAB_0014d9d6:
      bVar1 = p_Var4 == local_88;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      return bVar1;
    }
    p_Var5 = (_List_node_base *)&p_Var4[1]._M_prev;
    while (p_Var5 = p_Var5->_M_next, p_Var5 != (_List_node_base *)&p_Var4[1]._M_prev) {
      v = p_Var5 + 1;
      ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_98,(shared_ptr<mocker::ir::IRInst> *)v);
      if (local_98 != 0) {
        ir::dycLocalReg(&local_80);
        if ((local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0) &&
           (bVar1 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                              ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_68,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_80.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 1)), bVar1)) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          goto LAB_0014d90e;
        }
LAB_0014d9bd:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
LAB_0014d9c7:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
        goto LAB_0014d9d6;
      }
LAB_0014d90e:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_98,(shared_ptr<mocker::ir::IRInst> *)v);
      if (local_98 != 0) {
        ir::dycLocalReg(&local_80);
        if ((local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
             (element_type *)0x0) ||
           (bVar1 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                              ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_68,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_80.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 1)), !bVar1)) goto LAB_0014d9bd;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_80.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
      ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_98,(shared_ptr<mocker::ir::IRInst> *)v);
      if (((local_98 != 0) &&
          (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_98 + 0x28),&func->identifier), !_Var2)) &&
         (bVar1 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_98 + 0x28)), !bVar1)) goto LAB_0014d9c7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
    }
  } while( true );
}

Assistant:

bool FuncAttr::isPureFunc(const ir::FunctionModule &func) {
  std::unordered_set<std::string> stackVar;
  for (auto &inst : func.getBasicBlock(func.getFirstBBLabel()).getInsts()) {
    auto alloca = ir::dyc<ir::Alloca>(inst);
    if (!alloca)
      continue;
    stackVar.emplace(alloca->getDest()->getIdentifier());
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      if (auto p = ir::dyc<ir::Store>(inst)) {
        auto reg = ir::dycLocalReg(p->getAddr());
        if (!reg || !isIn(stackVar, reg->getIdentifier()))
          return false;
      }
      if (auto p = ir::dyc<ir::Load>(inst)) {
        auto reg = ir::dycLocalReg(p->getAddr());
        if (!reg || !isIn(stackVar, reg->getIdentifier()))
          return false;
      }
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (call->getFuncName() == func.getIdentifier())
          continue;
        if (!isIn(pureFuncs, call->getFuncName()))
          return false;
      }
    }
  }
  return true;
}